

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch_and_reduce_algorithm.cpp
# Opt level: O1

bool __thiscall
branch_and_reduce_algorithm::unconfinedReduction_a(branch_and_reduce_algorithm *this)

{
  pointer piVar1;
  pointer pvVar2;
  int *piVar3;
  pointer piVar4;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var5;
  void *pvVar6;
  int iVar7;
  ulong uVar8;
  int *piVar9;
  pointer piVar10;
  pointer *ppiVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  int *piVar16;
  pointer piVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  iterator iVar21;
  vector<int,std::allocator<int>> *pvVar22;
  int iVar23;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var24;
  bool bVar25;
  int z;
  vector<int,_std::allocator<int>_> extends;
  vector<int,_std::allocator<int>_> copyOfqs;
  int local_d0;
  int local_cc;
  int *local_c8;
  iterator iStack_c0;
  int *local_b8;
  long local_b0;
  int local_a8;
  undefined4 uStack_a4;
  long local_98;
  ulong local_90;
  int local_84;
  pointer local_80;
  _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *local_78;
  vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
  *local_70;
  long local_68;
  pointer local_60;
  vector<int,std::allocator<int>> *local_58;
  pointer *local_50;
  vector<int,std::allocator<int>> *local_48;
  pointer *local_40;
  pointer local_38;
  
  local_84 = this->rn;
  if (0 < this->n) {
    local_70 = (vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
                *)&this->packing;
    local_78 = (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
               &this->packingCandidates;
    local_40 = &(this->b_vtcs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish;
    local_48 = (vector<int,std::allocator<int>> *)&this->b_vtcs;
    local_50 = &(this->unconf_vtcs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish;
    local_58 = (vector<int,std::allocator<int>> *)&this->unconf_vtcs;
    lVar15 = 0;
    do {
      piVar10 = (this->x).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      local_b0 = lVar15;
      if (piVar10[lVar15] < 0) {
        iVar13 = (this->used).uid;
        (this->used).uid = iVar13 + 1;
        if (iVar13 < -1) {
          piVar1 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar14 = (long)(this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)piVar1;
          if (lVar14 != 0) {
            uVar20 = 0;
            do {
              piVar1[uVar20] = 0;
              uVar20 = uVar20 + 1;
            } while ((uVar20 & 0xffffffff) < (ulong)(lVar14 >> 2));
          }
          (this->used).uid = 1;
        }
        piVar1 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar1[lVar15] = (this->used).uid;
        pvVar2 = (this->adj).
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_68 = lVar15 * 3;
        piVar9 = pvVar2[lVar15].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar3 = *(pointer *)
                  ((long)&pvVar2[lVar15].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data + 8);
        if (piVar9 == piVar3) {
          uVar20 = 0;
        }
        else {
          piVar17 = (this->level).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          piVar4 = (this->iter).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar20 = 0;
          do {
            iVar13 = *piVar9;
            if (piVar10[iVar13] < 0) {
              piVar1[iVar13] = (this->used).uid;
              iVar12 = (int)uVar20;
              uVar20 = (ulong)(iVar12 + 1);
              piVar17[iVar12] = iVar13;
              piVar4[iVar13] = 1;
            }
            piVar9 = piVar9 + 1;
          } while (piVar9 != piVar3);
        }
        iVar13 = 1;
        bVar25 = false;
        do {
          if (bVar25) break;
          local_c8 = (int *)0x0;
          iStack_c0._M_current = (int *)0x0;
          local_b8 = (int *)0x0;
          if (0 < (int)uVar20) {
            uVar18 = 0;
            do {
              iVar12 = (this->level).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar18];
              iVar23 = 0xb;
              if ((this->iter).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar12] == 1) {
                local_d0 = -1;
                pvVar2 = (this->adj).
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                piVar9 = pvVar2[iVar12].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
                piVar3 = *(pointer *)
                          ((long)&pvVar2[iVar12].super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data + 8);
                if (piVar9 != piVar3) {
                  iVar12 = -1;
                  do {
                    iVar23 = *piVar9;
                    if ((((this->x).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[iVar23] < 0) &&
                        ((this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[iVar23] != (this->used).uid)) &&
                       (bVar25 = -1 < iVar12, local_d0 = iVar23, iVar12 = iVar23, bVar25)) {
                      local_d0 = -2;
                      break;
                    }
                    piVar9 = piVar9 + 1;
                  } while (piVar9 != piVar3);
                }
                if (local_d0 == -1) {
                  if (2 < REDUCTION) {
                    _Var5._M_current =
                         (this->que).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
                    *_Var5._M_current = 1;
                    piVar9 = *(int **)((long)&(pvVar2->super__Vector_base<int,_std::allocator<int>_>
                                              )._M_impl.super__Vector_impl_data + local_68 * 8);
                    piVar3 = *(int **)((long)&(pvVar2->super__Vector_base<int,_std::allocator<int>_>
                                              )._M_impl.super__Vector_impl_data + local_68 * 8 + 8);
                    if (piVar9 == piVar3) {
                      lVar14 = 1;
                    }
                    else {
                      piVar10 = (this->x).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start;
                      iVar12 = 1;
                      do {
                        if (piVar10[*piVar9] < 0) {
                          lVar14 = (long)iVar12;
                          iVar12 = iVar12 + 1;
                          _Var5._M_current[lVar14] = *piVar9;
                        }
                        piVar9 = piVar9 + 1;
                      } while (piVar9 != piVar3);
                      lVar14 = (long)iVar12;
                    }
                    std::vector<int,std::allocator<int>>::
                    vector<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
                              ((vector<int,std::allocator<int>> *)&local_a8,_Var5,
                               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                               (_Var5._M_current + lVar14),(allocator_type *)&local_cc);
                    std::
                    vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
                    ::emplace_back<std::vector<int,std::allocator<int>>>
                              (local_70,(vector<int,_std::allocator<int>_> *)&local_a8);
                    if (USE_DEPENDENCY_CHECKING == true) {
                      pvVar2 = (this->packing).
                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
                      local_cc = (int)((ulong)((long)pvVar2 -
                                              (long)(this->packing).
                                                                                                        
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                                 -0x55555555 + -1;
                      piVar10 = pvVar2[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start;
                      if (4 < (ulong)((long)pvVar2[-1].super__Vector_base<int,_std::allocator<int>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)piVar10)) {
                        uVar19 = 1;
                        do {
                          pvVar22 = (vector<int,std::allocator<int>> *)
                                    ((this->packingMap).
                                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + piVar10[uVar19]);
                          iVar21._M_current = *(int **)(pvVar22 + 8);
                          if (iVar21._M_current == *(int **)(pvVar22 + 0x10)) {
                            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                                      (pvVar22,iVar21,&local_cc);
                          }
                          else {
                            *iVar21._M_current = local_cc;
                            *(int **)(pvVar22 + 8) = iVar21._M_current + 1;
                          }
                          uVar19 = uVar19 + 1;
                          piVar10 = pvVar2[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl
                                    .super__Vector_impl_data._M_start;
                        } while (uVar19 < (ulong)((long)pvVar2[-1].
                                                                                                                
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                                  (long)piVar10 >> 2));
                      }
                      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>
                      ::_M_emplace_unique<int&>(local_78,&local_cc);
                      lVar15 = local_b0;
                    }
                    pvVar6 = (void *)CONCAT44(uStack_a4,local_a8);
                    if (pvVar6 != (void *)0x0) {
                      operator_delete(pvVar6,local_98 - (long)pvVar6);
                    }
                  }
                  iVar23 = 0x10;
                  set(this,(int)lVar15,1);
                }
                else {
                  iVar23 = 0;
                  if (-1 < local_d0) {
                    iVar23 = 0;
                    if (iStack_c0._M_current == local_b8) {
                      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                                ((vector<int,std::allocator<int>> *)&local_c8,iStack_c0,&local_d0);
                    }
                    else {
                      *iStack_c0._M_current = local_d0;
                      iStack_c0._M_current = iStack_c0._M_current + 1;
                    }
                  }
                }
              }
              if ((iVar23 != 0xb) && (iVar23 != 0)) goto LAB_001106c8;
              uVar18 = uVar18 + 1;
            } while (uVar18 != uVar20);
          }
          iVar23 = 9;
LAB_001106c8:
          bVar25 = true;
          if (iVar23 == 9) {
            bVar25 = iStack_c0._M_current == local_c8;
            if (!bVar25) {
              if ((long)iStack_c0._M_current - (long)local_c8 == 4) {
                local_a8 = *local_c8;
                if (BRANCHING == 0x1f) {
                  iVar21._M_current =
                       (this->unconf_vtcs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish;
                  ppiVar11 = local_50;
                  pvVar22 = local_58;
                  if (iVar21._M_current ==
                      (this->unconf_vtcs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
LAB_0011074a:
                    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                              (pvVar22,iVar21,&local_a8);
                    goto LAB_00110754;
                  }
                }
                else {
                  iVar21._M_current =
                       (this->b_vtcs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish;
                  ppiVar11 = local_40;
                  pvVar22 = local_48;
                  if (iVar21._M_current ==
                      (this->b_vtcs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage) goto LAB_0011074a;
                }
                *iVar21._M_current = local_a8;
                *ppiVar11 = iVar21._M_current + 1;
              }
LAB_00110754:
              iVar12 = *local_c8;
              piVar10 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
              piVar10[iVar12] = (this->used).uid;
              iVar13 = iVar13 + 1;
              pvVar2 = (this->adj).
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              piVar9 = pvVar2[iVar12].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
              piVar3 = *(pointer *)
                        ((long)&pvVar2[iVar12].super__Vector_base<int,_std::allocator<int>_>._M_impl
                                .super__Vector_impl_data + 8);
              if (piVar9 != piVar3) {
                piVar1 = (this->x).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
                piVar17 = (this->level).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start;
                piVar4 = (this->iter).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
                do {
                  iVar12 = *piVar9;
                  if (piVar1[iVar12] < 0) {
                    iVar23 = (this->used).uid;
                    iVar7 = piVar10[iVar12];
                    piVar10[iVar12] = iVar23;
                    if (iVar7 == iVar23) {
                      piVar16 = piVar4 + iVar12;
                      *piVar16 = *piVar16 + 1;
                    }
                    else {
                      iVar23 = (int)uVar20;
                      uVar20 = (ulong)(iVar23 + 1);
                      piVar17[iVar23] = iVar12;
                      piVar4[iVar12] = 1;
                    }
                  }
                  piVar9 = piVar9 + 1;
                } while (piVar9 != piVar3);
              }
              bVar25 = false;
            }
            iVar23 = 0;
          }
          if (local_c8 != (int *)0x0) {
            operator_delete(local_c8,(long)local_b8 - (long)local_c8);
          }
        } while (iVar23 == 0);
        lVar14 = local_b0;
        piVar10 = (this->x).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if (1 < iVar13 && piVar10[lVar15] < 0) {
          iVar13 = (this->used).uid;
          (this->used).uid = iVar13 + 1;
          if (iVar13 < -1) {
            piVar1 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            lVar15 = (long)(this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish - (long)piVar1;
            if (lVar15 != 0) {
              uVar18 = 0;
              do {
                piVar1[uVar18] = 0;
                uVar18 = uVar18 + 1;
              } while ((uVar18 & 0xffffffff) < (ulong)(lVar15 >> 2));
            }
            (this->used).uid = 1;
          }
          iVar13 = (int)uVar20;
          if (0 < iVar13) {
            piVar1 = (this->level).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            piVar17 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            uVar18 = 0;
            do {
              piVar17[piVar1[uVar18]] = (this->used).uid;
              uVar18 = uVar18 + 1;
            } while (uVar20 != uVar18);
          }
          if (0 < iVar13) {
            pvVar2 = (this->adj).
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            piVar1 = (this->que).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            piVar17 = (this->level).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            piVar4 = (this->iter).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            uVar18 = 0;
            do {
              piVar1[(long)(int)uVar18 + (long)this->n] = -1;
              piVar1[uVar18] = -1;
              iVar12 = piVar17[uVar18];
              if (piVar4[iVar12] == 2) {
                piVar9 = pvVar2[iVar12].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
                piVar3 = *(pointer *)
                          ((long)&pvVar2[iVar12].super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data + 8);
                if (piVar9 == piVar3) {
                  iVar23 = -1;
                  iVar12 = -1;
                }
                else {
                  iVar12 = -1;
                  iVar23 = -1;
                  do {
                    piVar16 = piVar9 + 1;
                    iVar7 = *piVar9;
                    if ((piVar10[iVar7] < 0) &&
                       ((this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[iVar7] != (this->used).uid)) {
                      if (iVar23 < 0) {
                        bVar25 = false;
                        iVar23 = iVar7;
                      }
                      else if (iVar12 < 0) {
                        bVar25 = false;
                        iVar12 = iVar7;
                      }
                      else {
                        bVar25 = true;
                        iVar23 = -1;
                        iVar12 = -1;
                      }
                    }
                    else {
                      bVar25 = false;
                    }
                  } while ((!bVar25) && (piVar9 = piVar16, piVar16 != piVar3));
                }
                iVar7 = iVar12;
                if (iVar23 < iVar12) {
                  iVar7 = iVar23;
                }
                if (iVar12 < iVar23) {
                  iVar12 = iVar23;
                }
                piVar1[uVar18] = iVar7;
                piVar1[(long)(int)uVar18 + (long)this->n] = iVar12;
              }
              uVar18 = uVar18 + 1;
            } while (uVar18 != uVar20);
          }
          local_90 = uVar20;
          if (0 < iVar13) {
            _Var5._M_current =
                 (this->que).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
            local_38 = (this->level).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
            local_60 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish;
            piVar10 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            local_80 = (this->adj).
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            piVar1 = (this->x).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            uVar19 = 0;
            piVar17 = local_38;
            uVar18 = uVar20;
            _Var24._M_current = _Var5._M_current;
            do {
              if ((-1 < _Var5._M_current[uVar19]) &&
                 (-1 < _Var5._M_current[(long)(int)uVar19 + (long)this->n])) {
                iVar13 = local_38[uVar19];
                iVar12 = (this->used).uid;
                (this->used).uid = iVar12 + 1;
                if (iVar12 < -1) {
                  if (local_60 != piVar10) {
                    uVar8 = 0;
                    do {
                      piVar10[uVar8] = 0;
                      uVar8 = uVar8 + 1;
                    } while ((uVar8 & 0xffffffff) < (ulong)((long)local_60 - (long)piVar10 >> 2));
                  }
                  (this->used).uid = 1;
                }
                piVar9 = local_80[iVar13].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
                piVar3 = *(pointer *)
                          ((long)&local_80[iVar13].super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data + 8);
                if (piVar9 != piVar3) {
                  piVar4 = (this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  do {
                    if (piVar1[*piVar9] < 0) {
                      piVar4[*piVar9] = (this->used).uid;
                    }
                    piVar9 = piVar9 + 1;
                  } while (piVar9 != piVar3);
                }
                if (uVar19 + 1 < uVar20) {
                  uVar8 = 1;
LAB_00110acc:
                  if (((_Var5._M_current[uVar19] != _Var24._M_current[uVar8]) ||
                      (_Var5._M_current[(long)(int)uVar19 + (long)this->n] !=
                       _Var24._M_current[(long)this->n + uVar8])) ||
                     ((this->used).used.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[piVar17[uVar8]] == (this->used).uid))
                  goto LAB_00110aea;
                  if (2 < REDUCTION) {
                    *_Var5._M_current = 1;
                    piVar9 = *(int **)((long)&(local_80->
                                              super__Vector_base<int,_std::allocator<int>_>)._M_impl
                                              .super__Vector_impl_data + local_68 * 8);
                    piVar3 = *(int **)((long)&(local_80->
                                              super__Vector_base<int,_std::allocator<int>_>)._M_impl
                                              .super__Vector_impl_data + local_68 * 8 + 8);
                    if (piVar9 == piVar3) {
                      lVar15 = 1;
                    }
                    else {
                      piVar10 = (this->x).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start;
                      iVar13 = 1;
                      do {
                        if (piVar10[*piVar9] < 0) {
                          lVar15 = (long)iVar13;
                          iVar13 = iVar13 + 1;
                          _Var5._M_current[lVar15] = *piVar9;
                        }
                        piVar9 = piVar9 + 1;
                      } while (piVar9 != piVar3);
                      lVar15 = (long)iVar13;
                    }
                    std::vector<int,std::allocator<int>>::
                    vector<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
                              ((vector<int,std::allocator<int>> *)&local_c8,_Var5,
                               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                               (_Var5._M_current + lVar15),(allocator_type *)&local_a8);
                    std::
                    vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
                    ::emplace_back<std::vector<int,std::allocator<int>>>
                              (local_70,(vector<int,_std::allocator<int>_> *)&local_c8);
                    if (USE_DEPENDENCY_CHECKING == true) {
                      pvVar2 = (this->packing).
                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
                      local_a8 = (int)((ulong)((long)pvVar2 -
                                              (long)(this->packing).
                                                                                                        
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                                 -0x55555555 + -1;
                      piVar10 = pvVar2[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start;
                      if (4 < (ulong)((long)pvVar2[-1].super__Vector_base<int,_std::allocator<int>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)piVar10)) {
                        uVar20 = 1;
                        do {
                          pvVar22 = (vector<int,std::allocator<int>> *)
                                    ((this->packingMap).
                                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + piVar10[uVar20]);
                          iVar21._M_current = *(int **)(pvVar22 + 8);
                          if (iVar21._M_current == *(int **)(pvVar22 + 0x10)) {
                            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                                      (pvVar22,iVar21,&local_a8);
                          }
                          else {
                            *iVar21._M_current = local_a8;
                            *(int **)(pvVar22 + 8) = iVar21._M_current + 1;
                          }
                          uVar20 = uVar20 + 1;
                          piVar10 = pvVar2[-1].super__Vector_base<int,_std::allocator<int>_>._M_impl
                                    .super__Vector_impl_data._M_start;
                        } while (uVar20 < (ulong)((long)pvVar2[-1].
                                                                                                                
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                                  (long)piVar10 >> 2));
                      }
                      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>
                      ::_M_emplace_unique<int&>(local_78,&local_a8);
                    }
                    if (local_c8 != (int *)0x0) {
                      operator_delete(local_c8,(long)local_b8 - (long)local_c8);
                    }
                  }
                  set(this,(int)lVar14,1);
                  break;
                }
              }
LAB_00110af2:
              uVar19 = uVar19 + 1;
              _Var24._M_current = _Var24._M_current + 1;
              piVar17 = piVar17 + 1;
              uVar18 = uVar18 - 1;
            } while (uVar19 != uVar20);
          }
        }
      }
      lVar15 = local_b0 + 1;
    } while (lVar15 < this->n);
  }
  iVar13 = local_84;
  if (((2 < debug) && (this->depth <= this->maxDepth)) && (local_84 != this->rn)) {
    unconfinedReduction_a();
  }
  return iVar13 != this->rn;
LAB_00110aea:
  uVar8 = uVar8 + 1;
  if (uVar18 == uVar8) goto LAB_00110af2;
  goto LAB_00110acc;
}

Assistant:

bool branch_and_reduce_algorithm::unconfinedReduction_a()
{
    int oldn = rn;
#if 1
    std::vector<int> &NS = level;
    std::vector<int> &deg = iter;
    for (int v = 0; v < n; v++)
        if (x[v] < 0)
        {
            used.clear();
            used.add(v); // add v to set S
            int p = 1, size = 0;
            for (int u : adj[v]) // add N(v) to set S
                if (x[u] < 0)
                {
                    used.add(u);
                    NS[size++] = u;
                    deg[u] = 1;
                }
            bool ok = false;

            while (!ok) //
            {
                ok = true;
                std::vector<int> extends;

                for (int i = 0; i < size; i++)
                {
                    int const u = NS[i];
                    if (deg[u] != 1)
                    {
                        continue;
                    }
                    int z = -1;
                    for (int const w : adj[u])
                        if (x[w] < 0 && !used.get(w)) // w is in N(u) but not N(S)
                        {
                            if (z >= 0)
                            {
                                z = -2; // |N(u)\N(S)| >= 2
                                break;
                            }
                            z = w;
                        }
                    if (z == -1) // u is child with N(u)\N(S) = 0
                    {
                        if (REDUCTION >= 3)
                        {
                            std::vector<int> &qs = que;
                            int q = 0;
                            qs[q++] = 1;
                            for (int w : adj[v])
                                if (x[w] < 0)
                                    qs[q++] = w;
                            std::vector<int> copyOfqs(qs.begin(), qs.begin() + q);
                            pushPacking(copyOfqs);
                        }
                        set(v, 1);
                        goto whileloopend;
                    }
                    else if (z >= 0) // u is extending child
                    {
                        extends.push_back(z);
                    }
                }

                if (extends.size() > 0)
                {
                    if (extends.size() == 1)
                    {
                        // unconf_vtcs.push_back(extends[0]);
                        int vtx = extends[0];
                        if (BRANCHING == 31) unconf_vtcs.push_back(vtx);
                        else b_vtcs.push_back(vtx);
                    }
                    int z = extends[0];
                    ok = false;
                    used.add(z);
                    p++;
                    for (int w : adj[z])
                        if (x[w] < 0)
                        {
                            if (used.add(w))
                            {
                                NS[size++] = w;
                                deg[w] = 1;
                            }
                            else
                            {
                                deg[w]++;
                            }
                        }
                }
            }
        whileloopend:
            if (x[v] < 0 && p >= 2)
            {
                used.clear();
                for (int i = 0; i < size; i++)
                    used.add(NS[i]);
                std::vector<int> &vs = que;
                for (int i = 0; i < size; i++)
                {
                    vs[i] = vs[n + i] = -1;
                    int u = NS[i];
                    if (deg[u] != 2)
                        continue;
                    int v1 = -1, v2 = -1;
                    for (int w : adj[u])
                        if (x[w] < 0 && !used.get(w))
                        {
                            if (v1 < 0)
                                v1 = w;
                            else if (v2 < 0)
                                v2 = w;
                            else
                            {
                                v1 = v2 = -1;
                                break;
                            }
                        }
                    if (v1 > v2)
                    {
                        int t = v1;
                        v1 = v2;
                        v2 = t;
                    }
                    vs[i] = v1;
                    vs[n + i] = v2;
                }
                for (int i = 0; i < size; i++)
                    if (vs[i] >= 0 && vs[n + i] >= 0)
                    {
                        int u = NS[i];
                        used.clear();
                        for (int w : adj[u])
                            if (x[w] < 0)
                                used.add(w);
                        for (int j = i + 1; j < size; j++)
                            if (vs[i] == vs[j] && vs[n + i] == vs[n + j] && !used.get(NS[j]))
                            {
                                if (REDUCTION >= 3)
                                {
                                    std::vector<int> &qs = que;
                                    int q = 0;
                                    qs[q++] = 1;
                                    for (int w : adj[v])
                                        if (x[w] < 0)
                                            qs[q++] = w;
                                    std::vector<int> copyOfqs(qs.begin(), qs.begin() + q);
                                    pushPacking(copyOfqs);
                                }
                                set(v, 1);
                                goto forloopend;
                            }
                    }
            forloopend:;
            }
        }
    if (debug >= 3 && depth <= maxDepth && oldn != rn)
        fprintf(stderr, "%sunconfined: %d -> %d\n", debugString().c_str(), oldn, rn);
#endif //0
    return oldn != rn;
}